

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * tokenExpr(Parse *pParse,int op,Token t)

{
  Expr *pEVar1;
  RenameToken *pRVar2;
  Expr *z;
  ulong __n;
  
  __n = (ulong)t.n;
  pEVar1 = (Expr *)sqlite3DbMallocRawNN(pParse->db,__n + 0x49);
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->op = (u8)op;
    pEVar1->affinity = '\0';
    pEVar1->flags = 0x800000;
    pEVar1->op2 = '\0';
    pEVar1->iTable = 0;
    pEVar1->iColumn = 0;
    pEVar1->iAgg = -1;
    z = pEVar1 + 1;
    pEVar1->pLeft = (Expr *)0x0;
    pEVar1->pRight = (Expr *)0x0;
    (pEVar1->x).pList = (ExprList *)0x0;
    pEVar1->pAggInfo = (AggInfo *)0x0;
    (pEVar1->y).pTab = (Table *)0x0;
    (pEVar1->u).zToken = (char *)z;
    memcpy(z,t.z,__n);
    (&pEVar1[1].op)[__n] = '\0';
    if ((char)""[pEVar1[1].op] < '\0') {
      pEVar1->flags = (uint)(pEVar1[1].op == 0x22) << 6 | 0x4800000;
      sqlite3Dequote((char *)z);
    }
    pEVar1->nHeight = 1;
    if (1 < pParse->eParseMode) {
      pRVar2 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
      if (pRVar2 != (RenameToken *)0x0) {
        pRVar2->p = pEVar1;
        (pRVar2->t).z = t.z;
        (pRVar2->t).n = t.n;
        pRVar2->pNext = pParse->pRename;
        pParse->pRename = pRVar2;
      }
    }
  }
  return pEVar1;
}

Assistant:

static Expr *tokenExpr(Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      /* memset(p, 0, sizeof(Expr)); */
      p->op = (u8)op;
      p->affinity = 0;
      p->flags = EP_Leaf;
      p->iAgg = -1;
      p->pLeft = p->pRight = 0;
      p->x.pList = 0;
      p->pAggInfo = 0;
      p->y.pTab = 0;
      p->op2 = 0;
      p->iTable = 0;
      p->iColumn = 0;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      if( sqlite3Isquote(p->u.zToken[0]) ){
        sqlite3DequoteExpr(p);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif  
      if( IN_RENAME_OBJECT ){
        return (Expr*)sqlite3RenameTokenMap(pParse, (void*)p, &t);
      }
    }
    return p;
  }